

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::generalizedGravityForces
          (KinDynComputations *this,Span<double,__1L> generalizedGravityForces)

{
  element_type *peVar1;
  element_type eVar2;
  element_type eVar3;
  long lVar4;
  element_type eVar5;
  element_type eVar6;
  element_type eVar7;
  Index size;
  long lVar8;
  ulong uVar9;
  pointer peVar10;
  ulong uVar11;
  extent_type<_1L> eVar12;
  long lVar13;
  ulong uVar14;
  
  peVar10 = generalizedGravityForces.storage_.data_;
  eVar12 = generalizedGravityForces.storage_.super_extent_type<_1L>.size_;
  lVar4 = iDynTree::Model::getNrOfDOFs();
  if (lVar4 + 6 == eVar12.size_) {
    KinDynComputations::generalizedGravityForces(this,&this->pimpl->m_generalizedForcesContainer);
    lVar8 = iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
    eVar5 = *(element_type *)(lVar8 + 0x10);
    eVar2 = *(element_type *)(lVar8 + 0x18);
    eVar6 = *(element_type *)(lVar8 + 0x20);
    eVar7 = *(element_type *)(lVar8 + 0x28);
    eVar3 = *(element_type *)(lVar8 + 0x30);
    *peVar10 = *(element_type *)(lVar8 + 8);
    peVar10[1] = eVar5;
    peVar10[2] = eVar2;
    peVar10[3] = eVar6;
    peVar10[4] = eVar7;
    peVar10[5] = eVar3;
    iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
    lVar8 = iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    uVar9 = iDynTree::Model::getNrOfDOFs();
    peVar10 = peVar10 + (eVar12.size_ - uVar9);
    uVar11 = uVar9;
    if ((((ulong)peVar10 & 7) == 0) &&
       (uVar11 = (ulong)((uint)((ulong)peVar10 >> 3) & 1), (long)uVar9 <= (long)uVar11)) {
      uVar11 = uVar9;
    }
    lVar13 = uVar9 - uVar11;
    if (0 < (long)uVar11) {
      uVar14 = 0;
      do {
        peVar10[uVar14] = *(element_type *)(lVar8 + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
    }
    uVar14 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
    if (1 < lVar13) {
      do {
        peVar1 = (element_type *)(lVar8 + uVar11 * 8);
        eVar2 = peVar1[1];
        peVar10[uVar11] = *peVar1;
        (peVar10 + uVar11)[1] = eVar2;
        uVar11 = uVar11 + 2;
      } while ((long)uVar11 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar9) {
      do {
        peVar10[uVar14] = *(element_type *)(lVar8 + uVar14 * 8);
        uVar14 = uVar14 + 1;
      } while (uVar9 != uVar14);
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","generalizedGravityForces",
               "Wrong size in input generalizedBiasForces");
  }
  return lVar4 + 6 == eVar12.size_;
}

Assistant:

bool KinDynComputations::generalizedGravityForces(Span<double> generalizedGravityForces)
{
    bool ok = generalizedGravityForces.size() == pimpl->m_robot_model.getNrOfDOFs() + 6;

    if( !ok )
    {
        reportError("KinDynComputations","generalizedGravityForces","Wrong size in input generalizedBiasForces");
        return false;
    }

    ok = this->generalizedGravityForces(pimpl->m_generalizedForcesContainer);

    if( !ok )
    {
        reportError("KinDynComputations","generalizedGravityForces","Unable to compute the bias forces");
        return false;
    }

    toEigen(generalizedGravityForces).head<6>() = toEigen(pimpl->m_generalizedForcesContainer.baseWrench());
    toEigen(generalizedGravityForces).tail(pimpl->m_robot_model.getNrOfDOFs()) = toEigen(pimpl->m_generalizedForcesContainer.jointTorques());

    return true;
}